

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O2

void __thiscall vox::VoxWriter::StopTimeLogging(VoxWriter *this)

{
  KeyFrame *__k;
  long lVar1;
  long lVar2;
  mapped_type_conflict *pmVar3;
  
  if (this->m_TimeLoggingEnabled == true) {
    lVar2 = std::chrono::_V2::steady_clock::now();
    lVar1 = (this->m_LastKeyFrameTime).__d.__r;
    __k = &this->m_KeyFrame;
    pmVar3 = std::
             map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
             ::operator[](&this->m_FrameTimes,__k);
    *pmVar3 = (double)((lVar2 - lVar1) / 1000000) * 0.001;
    if ((this->m_KeyFrameTimeLoggingFunctor).super__Function_base._M_manager != (_Manager_type)0x0)
    {
      pmVar3 = std::
               map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
               ::at(&this->m_FrameTimes,__k);
      std::function<void_(const_unsigned_int_&,_const_double_&)>::operator()
                (&this->m_KeyFrameTimeLoggingFunctor,__k,pmVar3);
    }
    this->m_TotalTime = (double)((lVar2 - (this->m_StartTime).__d.__r) / 1000000) * 0.001;
    this->m_TimeLoggingEnabled = false;
  }
  return;
}

Assistant:

void VoxWriter::StopTimeLogging() {
    if (m_TimeLoggingEnabled) {
        const auto now           = std::chrono::steady_clock::now();
        m_FrameTimes[m_KeyFrame] = std::chrono::duration_cast<std::chrono::milliseconds>(now - m_LastKeyFrameTime).count() * 1e-3;
        if (m_KeyFrameTimeLoggingFunctor) {
            m_KeyFrameTimeLoggingFunctor(m_KeyFrame, m_FrameTimes.at(m_KeyFrame));
        }
        m_TotalTime              = std::chrono::duration_cast<std::chrono::milliseconds>(now - m_StartTime).count() * 1e-3;
        m_TimeLoggingEnabled = false;
    }
}